

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3tmat_io.c
# Opt level: O0

int s3tmat_read(char *fn,float32 ****out_tmat,uint32 *out_n_tmat,uint32 *out_n_state)

{
  int iVar1;
  int32 iVar2;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar3;
  uint32 *chksum;
  undefined4 uVar4;
  uint32 local_5c;
  FILE *pFStack_58;
  uint32 swap;
  FILE *fp;
  char *do_chk;
  char *ver;
  uint32 tmp;
  uint32 ignore;
  uint32 sv_chksum;
  uint32 rd_chksum;
  uint32 *out_n_state_local;
  uint32 *out_n_tmat_local;
  float32 ****out_tmat_local;
  char *fn_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  ignore = 0;
  _sv_chksum = out_n_state;
  out_n_state_local = out_n_tmat;
  out_n_tmat_local = (uint32 *)out_tmat;
  out_tmat_local = (float32 ****)fn;
  pFStack_58 = s3open(fn,"rb",&local_5c);
  if (pFStack_58 == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    do_chk = s3get_gvn_fattr("version");
    if (do_chk == (char *)0x0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3tmat_io.c"
              ,0x54,"No version attribute for %s\n",out_tmat_local);
      exit(1);
    }
    iVar1 = strcmp(do_chk,"1.0");
    if (iVar1 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3tmat_io.c"
              ,0x50,"Version mismatch for %s, file ver: %s != reader ver: %s\n",out_tmat_local,
              do_chk,"1.0");
      exit(1);
    }
    fp = (FILE *)s3get_gvn_fattr("chksum0");
    chksum = &ignore;
    iVar2 = bio_fread_3d((void ****)out_n_tmat_local,4,out_n_state_local,(uint32 *)&ver,_sv_chksum,
                         pFStack_58,local_5c,chksum);
    uVar4 = (undefined4)((ulong)chksum >> 0x20);
    if (iVar2 < 0) {
      s3close(pFStack_58);
      fn_local._4_4_ = -1;
    }
    else {
      if (fp != (FILE *)0x0) {
        iVar2 = bio_fread(&tmp,4,1,pFStack_58,local_5c,(uint32 *)((long)&ver + 4));
        if (iVar2 != 1) {
          s3close(pFStack_58);
          return -1;
        }
        if (tmp != ignore) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3tmat_io.c"
                  ,0x6f,"Checksum error; read corrupted data.\n");
          exit(1);
        }
      }
      s3close(pFStack_58);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3tmat_io.c"
              ,0x76,"Read %s [%ux%ux%u array]\n",out_tmat_local,(ulong)*out_n_state_local,
              CONCAT44(uVar3,*_sv_chksum - 1),CONCAT44(uVar4,*_sv_chksum));
      fn_local._4_4_ = 0;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3tmat_read(const char *fn,
	    float32 ****out_tmat,
	    uint32 *out_n_tmat,
	    uint32 *out_n_state)
{
    uint32 rd_chksum = 0;
    uint32 sv_chksum;
    uint32 ignore;
    uint32 tmp;
    char *ver;
    char *do_chk;
    FILE *fp;
    uint32 swap;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, TMAT_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, TMAT_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    if (bio_fread_3d((void ****)out_tmat,
		  sizeof(float32),
		  out_n_tmat,
		  &tmp,
		  out_n_state,
		  fp,
		  swap,
		  &rd_chksum) < 0) {
	s3close(fp);

	return S3_ERROR;
    }

    if (do_chk) {
	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
	    s3close(fp);
	    
	    return S3_ERROR;
	}

	if (sv_chksum != rd_chksum) {
	    E_FATAL("Checksum error; read corrupted data.\n");
	}
    }

    s3close(fp);

    E_INFO("Read %s [%ux%ux%u array]\n",
	   fn, *out_n_tmat, (*out_n_state)-1, *out_n_state);

    return S3_SUCCESS;
}